

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O0

size_t cmsysBase64_Encode(uchar *input,size_t length,uchar *output,int mark_end)

{
  uchar *local_40;
  uchar *optr;
  uchar *end;
  uchar *ptr;
  int mark_end_local;
  uchar *output_local;
  size_t length_local;
  uchar *input_local;
  
  local_40 = output;
  for (end = input; 2 < (long)(input + (length - (long)end)); end = end + 3) {
    cmsysBase64_Encode3(end,local_40);
    local_40 = local_40 + 4;
  }
  if (input + (length - (long)end) == (uchar *)0x2) {
    cmsysBase64_Encode2(end,local_40);
    local_40 = local_40 + 4;
  }
  else if (input + (length - (long)end) == (uchar *)0x1) {
    cmsysBase64_Encode1(end,local_40);
    local_40 = local_40 + 4;
  }
  else if (mark_end != 0) {
    builtin_memcpy(local_40,"====",4);
    local_40 = local_40 + 4;
  }
  return (long)local_40 - (long)output;
}

Assistant:

size_t kwsysBase64_Encode(const unsigned char* input, size_t length,
                          unsigned char* output, int mark_end)
{
  const unsigned char* ptr = input;
  const unsigned char* end = input + length;
  unsigned char* optr = output;

  /* Encode complete triplet */

  while ((end - ptr) >= 3) {
    kwsysBase64_Encode3(ptr, optr);
    ptr += 3;
    optr += 4;
  }

  /* Encodes a 2-byte ending into 3 bytes and 1 pad byte and writes. */

  if (end - ptr == 2) {
    kwsysBase64_Encode2(ptr, optr);
    optr += 4;
  }

  /* Encodes a 1-byte ending into 2 bytes and 2 pad bytes */

  else if (end - ptr == 1) {
    kwsysBase64_Encode1(ptr, optr);
    optr += 4;
  }

  /* Do we need to mark the end */

  else if (mark_end) {
    optr[0] = optr[1] = optr[2] = optr[3] = '=';
    optr += 4;
  }

  return (size_t)(optr - output);
}